

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

AssertionExpr *
slang::ast::BinaryAssertionExpr::fromSyntax(BinaryPropertyExprSyntax *syntax,ASTContext *context)

{
  int iVar1;
  AssertionExpr *args_2;
  undefined4 extraout_var;
  PropertyExprSyntax *args;
  undefined4 extraout_var_00;
  BinaryAssertionExpr *pBVar2;
  int *in_RDI;
  BinaryAssertionOperator op;
  AssertionExpr *right;
  AssertionExpr *left;
  Compilation *comp;
  NondegeneracyRequirement nondegenRequirement;
  bitmask<slang::ast::ASTFlags> rflags;
  bitmask<slang::ast::ASTFlags> lflags;
  bool isNonOverlapOp;
  bool isOverlapOp;
  ASTContext *in_stack_fffffffffffffec8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffed0;
  SourceRange *args_3;
  Token *this;
  ASTContext *context_00;
  undefined4 in_stack_fffffffffffffef8;
  socklen_t __len;
  undefined3 in_stack_ffffffffffffff04;
  undefined3 uVar3;
  undefined4 uVar4;
  ASTContext local_d0;
  undefined8 local_98;
  underlying_type local_90;
  Token local_88 [3];
  SourceRange *local_50;
  Compilation *local_48;
  undefined4 local_3c;
  bitmask<slang::ast::ASTFlags> local_38;
  bitmask<slang::ast::ASTFlags> local_30;
  bitmask<slang::ast::ASTFlags> local_28;
  bitmask<slang::ast::ASTFlags> local_20;
  byte local_12;
  byte local_11;
  int *local_8;
  DiagCode code;
  
  uVar4 = CONCAT13(1,in_stack_ffffffffffffff04);
  if ((short)in_RDI[8] != 0x55) {
    uVar4 = CONCAT13((short)in_RDI[8] == 0x30,in_stack_ffffffffffffff04);
  }
  code.code._1_1_ = (byte)((uint)uVar4 >> 0x18);
  uVar3 = CONCAT12(1,(short)uVar4);
  if ((short)in_RDI[8] != 0x56) {
    uVar3 = CONCAT12((short)in_RDI[8] == 0x31,(short)uVar4);
  }
  code._0_3_ = uVar3;
  local_12 = (byte)((uint3)uVar3 >> 0x10);
  local_11 = code.code._1_1_;
  local_8 = in_RDI;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_20);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_28);
  if ((local_12 & 1) == 0) {
    if ((*local_8 == 0x19f) || (*local_8 == 0x1a0)) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_38,PropertyNegation);
      local_28.m_bits = local_38.m_bits;
      local_20.m_bits = local_38.m_bits;
    }
  }
  else {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_30,PropertyTimeAdvance);
    local_28.m_bits = local_30.m_bits;
  }
  local_3c = 0;
  if ((local_11 & 1) == 0) {
    if ((local_12 & 1) != 0) {
      local_3c = 2;
    }
  }
  else {
    local_3c = 1;
  }
  local_48 = ASTContext::getCompilation((ASTContext *)0x7d0a55);
  args_2 = (AssertionExpr *)
           not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                     ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x7d0a6e);
  local_90 = local_20.m_bits;
  this = local_88;
  ASTContext::resetFlags(in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
  __len = 0;
  iVar1 = AssertionExpr::bind((int)args_2,(sockaddr *)this,0);
  local_50 = (SourceRange *)CONCAT44(extraout_var,iVar1);
  args = not_null<slang::syntax::PropertyExprSyntax_*>::operator*
                   ((not_null<slang::syntax::PropertyExprSyntax_*> *)0x7d0ada);
  context_00 = &local_d0;
  ASTContext::resetFlags(in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
  iVar1 = AssertionExpr::bind((int)args,(sockaddr *)context_00,__len);
  local_98 = CONCAT44(extraout_var_00,iVar1);
  iVar1 = *local_8;
  if (iVar1 != 0xd) {
    if (iVar1 == 0xd1) {
      AssertionExpr::requireSequence
                ((AssertionExpr *)CONCAT44(__len,in_stack_fffffffffffffef8),context_00,code);
    }
    else if ((iVar1 != 0xec) && (iVar1 == 0xf3)) {
      AssertionExpr::requireSequence
                ((AssertionExpr *)CONCAT44(__len,in_stack_fffffffffffffef8),context_00,code);
    }
  }
  args_3 = local_50;
  parsing::Token::range(this);
  pBVar2 = BumpAllocator::
           emplace<slang::ast::BinaryAssertionExpr,slang::ast::BinaryAssertionOperator&,slang::ast::AssertionExpr_const&,slang::ast::AssertionExpr_const&,slang::SourceRange>
                     ((BumpAllocator *)context_00,(BinaryAssertionOperator *)args,
                      (AssertionExpr *)this,args_2,args_3);
  return &pBVar2->super_AssertionExpr;
}

Assistant:

AssertionExpr& BinaryAssertionExpr::fromSyntax(const BinaryPropertyExprSyntax& syntax,
                                               const ASTContext& context) {
    const bool isOverlapOp = (syntax.op.kind == TokenKind::OrMinusArrow) ||
                             (syntax.op.kind == TokenKind::HashMinusHash);
    const bool isNonOverlapOp = (syntax.op.kind == TokenKind::OrEqualsArrow) ||
                                (syntax.op.kind == TokenKind::HashEqualsHash);

    bitmask<ASTFlags> lflags, rflags;
    if (isNonOverlapOp) {
        rflags = ASTFlags::PropertyTimeAdvance;
    }
    else if (syntax.kind == SyntaxKind::SUntilPropertyExpr ||
             syntax.kind == SyntaxKind::SUntilWithPropertyExpr) {
        lflags = rflags = ASTFlags::PropertyNegation;
    }

    NondegeneracyRequirement nondegenRequirement = NondegeneracyRequirement::Default;
    if (isOverlapOp)
        nondegenRequirement = NondegeneracyRequirement::OverlapOp;
    else if (isNonOverlapOp)
        nondegenRequirement = NondegeneracyRequirement::NonOverlapOp;

    auto& comp = context.getCompilation();
    auto& left = bind(*syntax.left, context.resetFlags(lflags), false, nondegenRequirement);
    auto& right = bind(*syntax.right, context.resetFlags(rflags));

    // clang-format off
    BinaryAssertionOperator op;
    switch (syntax.kind) {
        case SyntaxKind::AndPropertyExpr: op = BinaryAssertionOperator::And; break;
        case SyntaxKind::OrPropertyExpr: op = BinaryAssertionOperator::Or; break;
        case SyntaxKind::IffPropertyExpr: op = BinaryAssertionOperator::Iff; break;
        case SyntaxKind::UntilPropertyExpr: op = BinaryAssertionOperator::Until; break;
        case SyntaxKind::SUntilPropertyExpr: op = BinaryAssertionOperator::SUntil; break;
        case SyntaxKind::UntilWithPropertyExpr: op = BinaryAssertionOperator::UntilWith; break;
        case SyntaxKind::SUntilWithPropertyExpr: op = BinaryAssertionOperator::SUntilWith; break;
        case SyntaxKind::ImpliesPropertyExpr: op = BinaryAssertionOperator::Implies; break;
        case SyntaxKind::ImplicationPropertyExpr:
            left.requireSequence(context, diag::PropertyLhsInvalid);
            op = syntax.op.kind == TokenKind::OrMinusArrow ? BinaryAssertionOperator::OverlappedImplication :
                                                             BinaryAssertionOperator::NonOverlappedImplication;
            break;
        case SyntaxKind::FollowedByPropertyExpr:
            left.requireSequence(context, diag::PropertyLhsInvalid);
            op = syntax.op.kind == TokenKind::HashMinusHash ? BinaryAssertionOperator::OverlappedFollowedBy :
                                                              BinaryAssertionOperator::NonOverlappedFollowedBy;
            break;
        default:
            SLANG_UNREACHABLE;
    }
    // clang-format on

    return *comp.emplace<BinaryAssertionExpr>(op, left, right, syntax.op.range());
}